

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O0

Abc_Obj_t * Abc_NodeFromGlobalBdds(Abc_Ntk_t *pNtkNew,DdManager *dd,DdNode *bFunc,int fReverse)

{
  int iVar1;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanin;
  DdNode *pDVar2;
  int local_5c;
  int local_3c;
  int i;
  Abc_Obj_t *pTemp;
  Abc_Obj_t *pNodeNew;
  int fReverse_local;
  DdNode *bFunc_local;
  DdManager *dd_local;
  Abc_Ntk_t *pNtkNew_local;
  
  pObj = Abc_NtkCreateNode(pNtkNew);
  for (local_3c = 0; iVar1 = Abc_NtkCiNum(pNtkNew), local_3c < iVar1; local_3c = local_3c + 1) {
    Abc_NtkCi(pNtkNew,local_3c);
    if (fReverse == 0) {
      local_5c = dd->invperm[local_3c];
    }
    else {
      iVar1 = Abc_NtkCiNum(pNtkNew);
      local_5c = (iVar1 + -1) - dd->invperm[local_3c];
    }
    pFanin = Abc_NtkCi(pNtkNew,local_5c);
    Abc_ObjAddFanin(pObj,pFanin);
  }
  pDVar2 = Extra_TransferLevelByLevel(dd,(DdManager *)pNtkNew->pManFunc,bFunc);
  (pObj->field_5).pData = pDVar2;
  Cudd_Ref((DdNode *)(pObj->field_5).pData);
  return pObj;
}

Assistant:

Abc_Obj_t * Abc_NodeFromGlobalBdds( Abc_Ntk_t * pNtkNew, DdManager * dd, DdNode * bFunc, int fReverse )
{
    Abc_Obj_t * pNodeNew, * pTemp;
    int i;
    // create a new node
    pNodeNew = Abc_NtkCreateNode( pNtkNew );
    // add the fanins in the order, in which they appear in the reordered manager
    Abc_NtkForEachCi( pNtkNew, pTemp, i )
        Abc_ObjAddFanin( pNodeNew, Abc_NtkCi(pNtkNew, fReverse ? Abc_NtkCiNum(pNtkNew)-1-dd->invperm[i] : dd->invperm[i]) );
    // transfer the function
    pNodeNew->pData = Extra_TransferLevelByLevel( dd, (DdManager *)pNtkNew->pManFunc, bFunc );  Cudd_Ref( (DdNode *)pNodeNew->pData );
    return pNodeNew;
}